

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O2

void outputDomains(DomainSet *dSet,string *fname,MatrixProperties *matProp,int start,float hier)

{
  pointer pDVar1;
  ostream *poVar2;
  pointer pDVar3;
  ofstream file;
  
  std::ofstream::ofstream((string *)&file);
  std::ofstream::open((string *)&file,(_Ios_Openmode)fname);
  pDVar1 = (dSet->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pDVar3 = (dSet->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
                super__Vector_impl_data._M_start; pDVar3 != pDVar1; pDVar3 = pDVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&file,(string *)&matProp->chrom);
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"Matryoshka1.0");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"Domain");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,".");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,".");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,".");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"Level=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,hier);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void outputDomains(DomainSet dSet, string fname, MatrixProperties matProp, int start, float hier) {
    ofstream file;
    file.open(fname, ios::app);
    int res = matProp.resolution;
    for (auto d : dSet) {
        //file << matProp.chrom << "\t" << (d.start+start)*res << "\t" << (d.end+start)*res << "\t" << hier << endl;
        //file << chromosome << tool << feature << start << end << score << strand << frame << hier << endl;
        file << matProp.chrom << "\t" << "Matryoshka1.0" << "\t" << "Domain" << "\t" << (d.start)*res << "\t" <<
            (d.end)*res << "\t" << "." << "\t" << "." << "\t" << "." << "\t" << "Level=" << hier << endl;
    }
    file.close();
}